

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O0

void __thiscall
cmDocumentationFormatter::PrintFormatted(cmDocumentationFormatter *this,ostream *os,char *text)

{
  ulong uVar1;
  undefined8 uVar2;
  char local_81;
  string local_80 [7];
  char ch_1;
  string paragraph;
  char local_49;
  string local_48 [7];
  char ch;
  string preformatted;
  char *ptr;
  char *text_local;
  ostream *os_local;
  cmDocumentationFormatter *this_local;
  
  preformatted.field_2._8_8_ = text;
  if (text != (char *)0x0) {
    while (*(char *)preformatted.field_2._8_8_ != '\0') {
      std::__cxx11::string::string(local_48);
      while (*(char *)preformatted.field_2._8_8_ == ' ') {
        local_49 = *(char *)preformatted.field_2._8_8_;
        while (local_49 != '\0' && local_49 != '\n') {
          std::__cxx11::string::append((ulong)local_48,'\x01');
          preformatted.field_2._8_8_ = preformatted.field_2._8_8_ + 1;
          local_49 = *(char *)preformatted.field_2._8_8_;
        }
        if (*(char *)preformatted.field_2._8_8_ != '\0') {
          preformatted.field_2._8_8_ = preformatted.field_2._8_8_ + 1;
          std::__cxx11::string::append((ulong)local_48,'\x01');
        }
      }
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        uVar2 = std::__cxx11::string::c_str();
        (*this->_vptr_cmDocumentationFormatter[3])(this,os,uVar2);
      }
      std::__cxx11::string::string(local_80);
      local_81 = *(char *)preformatted.field_2._8_8_;
      while (local_81 != '\0' && local_81 != '\n') {
        std::__cxx11::string::append((ulong)local_80,'\x01');
        preformatted.field_2._8_8_ = preformatted.field_2._8_8_ + 1;
        local_81 = *(char *)preformatted.field_2._8_8_;
      }
      if (*(char *)preformatted.field_2._8_8_ != '\0') {
        preformatted.field_2._8_8_ = preformatted.field_2._8_8_ + 1;
        std::__cxx11::string::append((ulong)local_80,'\x01');
      }
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        uVar2 = std::__cxx11::string::c_str();
        (*this->_vptr_cmDocumentationFormatter[4])(this,os,uVar2);
      }
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_48);
    }
  }
  return;
}

Assistant:

void cmDocumentationFormatter::PrintFormatted(std::ostream& os,
                                              const char* text)
{
  if (!text) {
    return;
  }
  const char* ptr = text;
  while (*ptr) {
    // Any ptrs starting in a space are treated as preformatted text.
    std::string preformatted;
    while (*ptr == ' ') {
      for (char ch = *ptr; ch && ch != '\n'; ++ptr, ch = *ptr) {
        preformatted.append(1, ch);
      }
      if (*ptr) {
        ++ptr;
        preformatted.append(1, '\n');
      }
    }
    if (!preformatted.empty()) {
      this->PrintPreformatted(os, preformatted.c_str());
    }

    // Other ptrs are treated as paragraphs.
    std::string paragraph;
    for (char ch = *ptr; ch && ch != '\n'; ++ptr, ch = *ptr) {
      paragraph.append(1, ch);
    }
    if (*ptr) {
      ++ptr;
      paragraph.append(1, '\n');
    }
    if (!paragraph.empty()) {
      this->PrintParagraph(os, paragraph.c_str());
    }
  }
}